

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

SerializedData * __thiscall
Diligent::DeviceObjectArchive::GetDeviceSpecificData
          (DeviceObjectArchive *this,ResourceType Type,char *Name,DeviceType DevType)

{
  char *__s2;
  int iVar1;
  const_iterator cVar2;
  undefined4 in_register_0000000c;
  undefined8 uVar3;
  char (*Args_1) [40];
  char (*in_R8) [32];
  string _msg;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  char *local_20;
  undefined7 uVar4;
  
  uVar3 = CONCAT44(in_register_0000000c,DevType);
  local_40._0_4_ = Type;
  local_20 = Name;
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_40 + 8),Name,false);
  cVar2 = std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)local_40);
  if (((Char *)local_40._8_8_ != (Char *)0x0) && ((long)local_30._M_allocated_capacity < 0)) {
    operator_delete__((void *)local_40._8_8_);
  }
  if (cVar2.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
      ._M_cur != (__node_type *)0x0) {
    __s2 = *(char **)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                            ._M_cur + 0x10);
    uVar4 = (undefined7)((ulong)uVar3 >> 8);
    Args_1 = (char (*) [40])CONCAT71(uVar4,__s2 != (char *)0x0);
    if (((Name == (char *)0x0) == (__s2 != (char *)0x0)) ||
       ((Args_1 = (char (*) [40])CONCAT71(uVar4,Name == (char *)0x0 || __s2 == (char *)0x0),
        Name != (char *)0x0 && __s2 != (char *)0x0 && (iVar1 = strcmp(Name,__s2), iVar1 != 0)))) {
      FormatString<char[26],char[40]>
                ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SafeStrEqual(Name, it->first.GetName())",Args_1);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_40._4_4_,local_40._0_4_),"GetDeviceSpecificData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x16a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_40._4_4_,local_40._0_4_) != &local_30) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_40._4_4_,local_40._0_4_),
                        local_30._M_allocated_capacity + 1);
      }
    }
    return (SerializedData *)
           ((ulong)DevType * 0x20 +
            (long)cVar2.
                  super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                  ._M_cur + 0x40);
  }
  FormatString<char[11],char_const*,char[32]>
            ((string *)local_40,(Diligent *)"Resource \'",(char (*) [11])&local_20,
             (char **)"\' is not present in the archive",in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,CONCAT44(local_40._4_4_,local_40._0_4_),0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_40._4_4_,local_40._0_4_) != &local_30) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_40._4_4_,local_40._0_4_),local_30._M_allocated_capacity + 1);
  }
  if (GetDeviceSpecificData(Diligent::DeviceObjectArchive::ResourceType,char_const*,Diligent::DeviceObjectArchive::DeviceType)
      ::NullData != '\0') {
    return &GetDeviceSpecificData::NullData;
  }
  GetDeviceSpecificData();
  return (SerializedData *)CONCAT44(local_40._4_4_,local_40._0_4_);
}

Assistant:

const SerializedData& DeviceObjectArchive::GetDeviceSpecificData(ResourceType Type,
                                                                 const char*  Name,
                                                                 DeviceType   DevType) const noexcept
{
    auto it = m_NamedResources.find(NamedResourceKey{Type, Name});
    if (it == m_NamedResources.end())
    {
        LOG_ERROR_MESSAGE("Resource '", Name, "' is not present in the archive");
        static const SerializedData NullData;
        return NullData;
    }
    VERIFY_EXPR(SafeStrEqual(Name, it->first.GetName()));
    return it->second.DeviceSpecific[static_cast<size_t>(DevType)];
}